

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O3

int oonf_cfg_clear_rawdb(void)

{
  cfg_db *pcVar1;
  int iVar2;
  
  pcVar1 = _oonf_raw_db;
  _oonf_raw_db = (cfg_db *)cfg_db_add();
  if (_oonf_raw_db == (cfg_db *)0x0) {
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x1e7,(void *)0x0,0,
               "Cannot create raw configuration database.");
    }
    iVar2 = -1;
    _oonf_raw_db = pcVar1;
  }
  else {
    cfg_db_remove(pcVar1);
    _oonf_raw_db->schema = &_oonf_schema;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
oonf_cfg_clear_rawdb(void) {
  struct cfg_db *db;

  /* remember old db */
  db = _oonf_raw_db;

  /* initialize database */
  if ((_oonf_raw_db = cfg_db_add()) == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create raw configuration database.");
    _oonf_raw_db = db;
    return -1;
  }

  /* free old db */
  cfg_db_remove(db);

  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);
  return 0;
}